

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O0

size_t __thiscall
asio::detail::epoll_reactor::
cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,size_t max_cancelled)

{
  size_t sVar1;
  size_t n;
  undefined1 local_48 [8];
  op_queue<asio::detail::scheduler_operation> ops;
  scoped_lock lock;
  size_t max_cancelled_local;
  per_timer_data *timer_local;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *queue_local;
  epoll_reactor *this_local;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock((scoped_lock *)&ops.back_,&this->mutex_);
  op_queue<asio::detail::scheduler_operation>::op_queue
            ((op_queue<asio::detail::scheduler_operation> *)local_48);
  sVar1 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel_timer(queue,timer,(op_queue<asio::detail::scheduler_operation> *)local_48,
                         max_cancelled);
  conditionally_enabled_mutex::scoped_lock::unlock((scoped_lock *)&ops.back_);
  scheduler::post_deferred_completions
            (this->scheduler_,(op_queue<asio::detail::scheduler_operation> *)local_48);
  op_queue<asio::detail::scheduler_operation>::~op_queue
            ((op_queue<asio::detail::scheduler_operation> *)local_48);
  conditionally_enabled_mutex::scoped_lock::~scoped_lock((scoped_lock *)&ops.back_);
  return sVar1;
}

Assistant:

std::size_t epoll_reactor::cancel_timer(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data& timer,
    std::size_t max_cancelled)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  std::size_t n = queue.cancel_timer(timer, ops, max_cancelled);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
  return n;
}